

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  bool bVar1;
  pointer pdVar2;
  double dVar3;
  initializer_list<double> __l;
  function<double_(double,_double)> func;
  vector<double,_std::allocator<double>_> test;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  double local_78;
  double local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  vector<double,_std::allocator<double>_> local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test fold...",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  local_98._M_unused._M_member_pointer = 0x3ff0000000000000;
  local_98._8_8_ = 0x3ff3333333333333;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_98;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_40,__l,(allocator_type *)local_68._M_pod_data);
  pdVar2 = local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<double_(double,_double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/foldLeft/main.cpp:15:44)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<double_(double,_double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/foldLeft/main.cpp:15:44)>
             ::_M_manager;
  std::function<double_(double,_double)>::function
            ((function<double_(double,_double)> *)&local_98,
             (function<double_(double,_double)> *)&local_68);
  if (pdVar2 == local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    bVar1 = false;
  }
  else {
    dVar3 = 0.0;
    do {
      local_78 = *pdVar2;
      local_70 = dVar3;
      if (local_88 == (code *)0x0) {
        std::__throw_bad_function_call();
        goto LAB_00101428;
      }
      dVar3 = (*local_80)(&local_98,&local_70,&local_78);
      pdVar2 = pdVar2 + 1;
    } while (pdVar2 != local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    bVar1 = dVar3 == 2.2;
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"passed!",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
    if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
LAB_00101428:
  __assert_fail("expectedFold==folded",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/foldLeft/main.cpp"
                ,0x11,"int main()");
}

Assistant:

int main(){
    
  cout << "Test fold..." << endl;
  vector<double> test={1.0, 1.2};     
  double expectedFold = 2.2;
  function< double(double,double)  > func= [](double  a, double  b){return a+b;};
  auto folded = Functional::foldLeft(test, func);  
  assert(expectedFold==folded);
  cout << "passed!" << endl;
  return 0;

}